

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
          (ConcurrentQueue<_zframe_t*,MyTraits> *this,consumer_token_t *token,_zframe_t **item)

{
  uint uVar1;
  ConcurrentQueueProducerTypelessBase *pCVar2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  ExplicitProducer *pEVar4;
  bool bVar5;
  uint uVar6;
  ConcurrentQueueProducerTypelessBase *pCVar7;
  uint32_t uVar8;
  ExplicitProducer *pEVar9;
  int iVar10;
  ConcurrentQueueProducerTypelessBase *pCVar11;
  ProducerToken **ppPVar12;
  ExplicitProducer *this_00;
  
  if ((token->desiredProducer == (ConcurrentQueueProducerTypelessBase *)0x0) ||
     (token->lastKnownGlobalOffset != *(uint32_t *)(this + 0x260))) {
    pCVar2 = *(ConcurrentQueueProducerTypelessBase **)this;
    pCVar7 = token->desiredProducer;
    if (pCVar2 == (ConcurrentQueueProducerTypelessBase *)0x0 &&
        pCVar7 == (ConcurrentQueueProducerTypelessBase *)0x0) {
      return false;
    }
    uVar1 = *(uint *)(this + 8);
    uVar8 = *(uint32_t *)(this + 0x260);
    if (pCVar7 == (ConcurrentQueueProducerTypelessBase *)0x0) {
      pCVar7 = (ConcurrentQueueProducerTypelessBase *)&pCVar2->inactive;
      if (pCVar2 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pCVar7 = pCVar2;
      }
      token->desiredProducer = pCVar7;
      iVar10 = ~(token->initialOffset % uVar1) + uVar1;
      pCVar11 = pCVar7;
      if (iVar10 != 0) {
        do {
          pCVar3 = pCVar11->next;
          ppPVar12 = &pCVar3[-1].token;
          if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            ppPVar12 = (ProducerToken **)0x0;
          }
          pCVar11 = (ConcurrentQueueProducerTypelessBase *)(ppPVar12 + 1);
          if (pCVar3 == (ConcurrentQueueProducerTypelessBase *)0x0) {
            pCVar11 = pCVar7;
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        token->desiredProducer = pCVar11;
        pCVar7 = pCVar11;
      }
    }
    uVar6 = uVar8 - token->lastKnownGlobalOffset;
    if (uVar1 <= uVar6) {
      uVar6 = uVar6 % uVar1;
    }
    if (uVar6 != 0) {
      pCVar11 = (ConcurrentQueueProducerTypelessBase *)&pCVar2->inactive;
      if (pCVar2 == (ConcurrentQueueProducerTypelessBase *)0x0) {
        pCVar11 = pCVar2;
      }
      do {
        pCVar2 = pCVar7->next;
        ppPVar12 = &pCVar2[-1].token;
        if (pCVar2 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          ppPVar12 = (ProducerToken **)0x0;
        }
        pCVar7 = (ConcurrentQueueProducerTypelessBase *)(ppPVar12 + 1);
        if (pCVar2 == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pCVar7 = pCVar11;
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      token->desiredProducer = pCVar7;
    }
    token->lastKnownGlobalOffset = uVar8;
    token->currentProducer = pCVar7;
    token->itemsConsumedFromCurrent = 0;
  }
  else {
    pCVar7 = token->currentProducer;
  }
  if (*(char *)&pCVar7[2].token == '\x01') {
    bVar5 = ExplicitProducer::dequeue<_zframe_t*>((ExplicitProducer *)&pCVar7[-1].token,item);
  }
  else {
    bVar5 = ImplicitProducer::dequeue<_zframe_t*>((ImplicitProducer *)&pCVar7[-1].token,item);
  }
  if (bVar5 == false) {
    pEVar4 = *(ExplicitProducer **)this;
    pCVar7 = token->currentProducer->next;
    this_00 = (ExplicitProducer *)&pCVar7[-1].token;
    if (pCVar7 == (ConcurrentQueueProducerTypelessBase *)0x0) {
      this_00 = pEVar4;
    }
    if (this_00 != (ExplicitProducer *)&token->currentProducer[-1].token) {
      do {
        if (this_00[0x48] == (ExplicitProducer)0x1) {
          bVar5 = ExplicitProducer::dequeue<_zframe_t*>(this_00,item);
        }
        else {
          bVar5 = ImplicitProducer::dequeue<_zframe_t*>((ImplicitProducer *)this_00,item);
        }
        if (bVar5 != false) {
          token->currentProducer = (ConcurrentQueueProducerTypelessBase *)(this_00 + 8);
          token->itemsConsumedFromCurrent = 1;
          return true;
        }
        pEVar9 = this_00 + 8;
        this_00 = (ExplicitProducer *)(*(long *)pEVar9 + -8);
        if (*(long *)pEVar9 == 0) {
          this_00 = pEVar4;
        }
        pEVar9 = (ExplicitProducer *)&token->currentProducer[-1].token;
        if (token->currentProducer == (ConcurrentQueueProducerTypelessBase *)0x0) {
          pEVar9 = (ExplicitProducer *)0x0;
        }
      } while (this_00 != pEVar9);
    }
    return false;
  }
  uVar8 = token->itemsConsumedFromCurrent + 1;
  token->itemsConsumedFromCurrent = uVar8;
  if (uVar8 == 0x100) {
    LOCK();
    *(int *)(this + 0x260) = *(int *)(this + 0x260) + 1;
    UNLOCK();
    return true;
  }
  return true;
}

Assistant:

bool try_dequeue(consumer_token_t& token, U& item)
	{
		// The idea is roughly as follows:
		// Every 256 items from one producer, make everyone rotate (increase the global offset) -> this means the highest efficiency consumer dictates the rotation speed of everyone else, more or less
		// If you see that the global offset has changed, you must reset your consumption counter and move to your designated place
		// If there's no items where you're supposed to be, keep moving until you find a producer with some items
		// If the global offset has not changed but you've run out of items to consume, move over from your current position until you find an producer with something in it
		
		if (token.desiredProducer == nullptr || token.lastKnownGlobalOffset != globalExplicitConsumerOffset.load(std::memory_order_relaxed)) {
			if (!update_current_producer_after_rotation(token)) {
				return false;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (static_cast<ProducerBase*>(token.currentProducer)->dequeue(item)) {
			if (++token.itemsConsumedFromCurrent == EXPLICIT_CONSUMER_CONSUMPTION_QUOTA_BEFORE_ROTATE) {
				globalExplicitConsumerOffset.fetch_add(1, std::memory_order_relaxed);
			}
			return true;
		}
		
		auto tail = producerListTail.load(std::memory_order_acquire);
		auto ptr = static_cast<ProducerBase*>(token.currentProducer)->next_prod();
		if (ptr == nullptr) {
			ptr = tail;
		}
		while (ptr != static_cast<ProducerBase*>(token.currentProducer)) {
			if (ptr->dequeue(item)) {
				token.currentProducer = ptr;
				token.itemsConsumedFromCurrent = 1;
				return true;
			}
			ptr = ptr->next_prod();
			if (ptr == nullptr) {
				ptr = tail;
			}
		}
		return false;
	}